

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralloc.c
# Opt level: O1

void * resize(void *ptr,size_t size)

{
  void *pvVar1;
  long lVar2;
  void *__ptr;
  
  if (*(int *)((long)ptr + -0x30) == 0x5a1106) {
    __ptr = (void *)((long)ptr + -0x30);
    pvVar1 = realloc(__ptr,size + 0x30);
    if (pvVar1 == (void *)0x0) {
      pvVar1 = (void *)0x0;
    }
    else {
      if ((pvVar1 != __ptr) && (lVar2 = *(long *)((long)pvVar1 + 8), lVar2 != 0)) {
        if (*(void **)(lVar2 + 0x10) == __ptr) {
          *(void **)(lVar2 + 0x10) = pvVar1;
        }
        if (*(long *)((long)pvVar1 + 0x18) != 0) {
          *(void **)(*(long *)((long)pvVar1 + 0x18) + 0x20) = pvVar1;
        }
        if (*(long *)((long)pvVar1 + 0x20) != 0) {
          *(void **)(*(long *)((long)pvVar1 + 0x20) + 0x18) = pvVar1;
        }
      }
      for (lVar2 = *(long *)((long)pvVar1 + 0x10); lVar2 != 0; lVar2 = *(long *)(lVar2 + 0x20)) {
        *(void **)(lVar2 + 8) = pvVar1;
      }
      pvVar1 = (void *)((long)pvVar1 + 0x30);
    }
    return pvVar1;
  }
  __assert_fail("info->canary == CANARY",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/util/ralloc.c"
                ,0x5f,"ralloc_header *get_header(const void *)");
}

Assistant:

static void *
resize(void *ptr, size_t size)
{
   ralloc_header *child, *old, *info;

   old = get_header(ptr);
   info = realloc(old, size + sizeof(ralloc_header));

   if (info == NULL)
      return NULL;

   /* Update parent and sibling's links to the reallocated node. */
   if (info != old && info->parent != NULL) {
      if (info->parent->child == old)
	 info->parent->child = info;

      if (info->prev != NULL)
	 info->prev->next = info;

      if (info->next != NULL)
	 info->next->prev = info;
   }

   /* Update child->parent links for all children */
   for (child = info->child; child != NULL; child = child->next)
      child->parent = info;

   return PTR_FROM_HEADER(info);
}